

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_3dfloors.cpp
# Opt level: O0

void R_3D_EnterSkybox(void)

{
  undefined1 local_20 [8];
  HeightStack current;
  
  local_20 = (undefined1  [8])height_top;
  current.height_top = height_cur;
  current.height_cur._0_4_ = height_max;
  TArray<HeightStack,_HeightStack>::Push(&toplist,(HeightStack *)local_20);
  height_top = (HeightLevel *)0x0;
  height_cur = (HeightLevel *)0x0;
  height_max = -1;
  CurrentSkybox = CurrentSkybox + 1;
  return;
}

Assistant:

void R_3D_EnterSkybox()
{
	HeightStack current;

	current.height_top = height_top;
	current.height_cur = height_cur;
	current.height_max = height_max;

	toplist.Push(current);

	height_top = NULL;
	height_cur = NULL;
	height_max = -1;

	CurrentSkybox++;
}